

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  ulong *iEnd;
  undefined8 *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  undefined8 uVar7;
  char cVar8;
  U32 maxDistance;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int *piVar13;
  ulong *puVar14;
  size_t sVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  BYTE *litEnd;
  seqDef *psVar24;
  U32 UVar25;
  uint uVar26;
  BYTE *litEnd_1;
  ulong *puVar27;
  BYTE *pBVar28;
  BYTE *pBVar29;
  long lVar30;
  long lVar31;
  ulong *puVar32;
  uint uVar33;
  int iVar34;
  U32 UVar35;
  ulong uVar36;
  ulong uVar37;
  int iVar38;
  int *piVar39;
  ulong *puVar40;
  ulong *puVar41;
  BYTE *pInLoopLimit;
  uint uVar42;
  BYTE *pStart;
  ulong uVar43;
  uint uVar44;
  ulong uVar45;
  int *piVar46;
  BYTE *litLimit_w_1;
  BYTE *litLimit_w;
  
  uVar9 = (ms->cParams).targetLength;
  uVar9 = uVar9 + (uVar9 == 0);
  pBVar4 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar23 = (int)pBVar4;
  iVar34 = (int)iEnd - iVar23;
  uVar21 = (ms->window).lowLimit;
  uVar10 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar44 = uVar21;
  if (uVar10 < iVar34 - uVar21) {
    uVar44 = iVar34 - uVar10;
  }
  UVar35 = ms->loadedDictEnd;
  if (UVar35 != 0) {
    uVar44 = uVar21;
  }
  pUVar5 = ms->hashTable;
  puVar2 = (ulong *)((long)src + (srcSize - 8));
  uVar21 = (ms->window).dictLimit;
  uVar42 = *rep;
  uVar26 = rep[1];
  cVar8 = (char)(ms->cParams).hashLog;
  if (uVar44 < uVar21) {
    if (src < puVar2) {
      pBVar6 = (ms->window).dictBase;
      piVar13 = (int *)(pBVar4 + uVar21);
      puVar27 = (ulong *)(pBVar6 + uVar21);
      bVar16 = 0x20 - cVar8;
      puVar14 = iEnd + -4;
      uVar10 = mls - 5;
      uVar43 = (ulong)uVar10;
      puVar40 = (ulong *)src;
      do {
        if (uVar10 < 4) {
          sVar15 = (*(code *)(&DAT_007d4b7c + *(int *)(&DAT_007d4b7c + uVar43 * 4)))();
          return sVar15;
        }
        uVar11 = (uint)((int)*puVar40 * -0x61c8864f) >> (bVar16 & 0x1f);
        uVar33 = pUVar5[uVar11];
        pBVar29 = pBVar4;
        if (uVar33 < uVar21) {
          pBVar29 = pBVar6;
        }
        uVar36 = (long)puVar40 - (long)pBVar4;
        UVar35 = (U32)uVar36;
        uVar18 = (UVar35 + 1) - uVar42;
        pBVar28 = pBVar4;
        if (uVar18 < uVar21) {
          pBVar28 = pBVar6;
        }
        pUVar5[uVar11] = UVar35;
        if (((uVar42 < (UVar35 + 1) - uVar44) && (2 < (uVar21 - 1) - uVar18)) &&
           (*(int *)(pBVar28 + uVar18) == *(int *)((long)puVar40 + 1))) {
          puVar20 = (ulong *)((long)puVar40 + 1);
          puVar32 = iEnd;
          if (uVar18 < uVar21) {
            puVar32 = puVar27;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar40 + 5),(BYTE *)((long)(pBVar28 + uVar18) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar32,(BYTE *)piVar13);
          uVar19 = (long)puVar20 - (long)src;
          puVar40 = (ulong *)seqStore->lit;
          if (puVar14 < puVar20) {
            puVar32 = puVar40;
            puVar41 = (ulong *)src;
            if (src <= puVar14) {
              puVar32 = (ulong *)((long)puVar40 + ((long)puVar14 - (long)src));
              uVar45 = *(ulong *)((long)src + 8);
              *puVar40 = *src;
              puVar40[1] = uVar45;
              puVar41 = puVar14;
              if (0x10 < (long)puVar14 - (long)src) {
                lVar30 = 0x10;
                do {
                  uVar7 = *(undefined8 *)((BYTE *)((long)src + lVar30) + 8);
                  puVar1 = (undefined8 *)((long)puVar40 + lVar30);
                  *puVar1 = *(undefined8 *)((long)src + lVar30);
                  puVar1[1] = uVar7;
                  pBVar29 = (BYTE *)((long)src + lVar30 + 0x10);
                  uVar7 = *(undefined8 *)(pBVar29 + 8);
                  puVar1[2] = *(undefined8 *)pBVar29;
                  puVar1[3] = uVar7;
                  lVar30 = lVar30 + 0x20;
                } while (puVar1 + 4 < puVar32);
              }
            }
            if (puVar41 < puVar20) {
              lVar30 = 0;
              do {
                *(BYTE *)((long)puVar32 + lVar30) = *(BYTE *)((long)puVar41 + lVar30);
                lVar30 = lVar30 + 1;
              } while ((long)puVar20 - (long)puVar41 != lVar30);
            }
LAB_006a3a2f:
            seqStore->lit = seqStore->lit + uVar19;
            psVar24 = seqStore->sequences;
            if (0xffff < uVar19) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar45 = *(ulong *)((long)src + 8);
            *puVar40 = *src;
            puVar40[1] = uVar45;
            pBVar29 = seqStore->lit;
            if (0x10 < uVar19) {
              uVar45 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar29 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar29 + 0x18) = uVar45;
              if (0x20 < (long)uVar19) {
                lVar30 = 0;
                do {
                  pBVar3 = (BYTE *)((long)src + lVar30 + 0x20);
                  uVar7 = *(undefined8 *)(pBVar3 + 8);
                  pBVar28 = pBVar29 + lVar30 + 0x20;
                  *(undefined8 *)pBVar28 = *(undefined8 *)pBVar3;
                  *(undefined8 *)(pBVar28 + 8) = uVar7;
                  pBVar3 = (BYTE *)((long)src + lVar30 + 0x30);
                  uVar7 = *(undefined8 *)(pBVar3 + 8);
                  *(undefined8 *)(pBVar28 + 0x10) = *(undefined8 *)pBVar3;
                  *(undefined8 *)(pBVar28 + 0x18) = uVar7;
                  lVar30 = lVar30 + 0x20;
                } while (pBVar28 + 0x20 < pBVar29 + uVar19);
              }
              goto LAB_006a3a2f;
            }
            seqStore->lit = pBVar29 + uVar19;
            psVar24 = seqStore->sequences;
          }
          psVar24->litLength = (U16)uVar19;
          psVar24->offset = 1;
          if (0xffff < sVar15 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar24->matchLength = (U16)(sVar15 + 1);
          psVar24 = psVar24 + 1;
          seqStore->sequences = psVar24;
          src = (void *)((long)puVar20 + sVar15 + 4);
          uVar33 = uVar42;
LAB_006a3b71:
          uVar42 = uVar33;
          puVar40 = (ulong *)src;
          if (src <= puVar2) {
            if (uVar10 < 4) {
              sVar15 = (*(code *)(&DAT_007d4b8c + *(int *)(&DAT_007d4b8c + uVar43 * 4)))();
              return sVar15;
            }
            pUVar5[(uint)(*(int *)(pBVar4 + (uVar36 & 0xffffffff) + 2) * -0x61c8864f) >>
                   (bVar16 & 0x1f)] = UVar35 + 2;
            pUVar5[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar16 & 0x1f)] =
                 ((int)src + -2) - iVar23;
            uVar33 = uVar42;
            do {
              uVar18 = uVar26;
              UVar25 = (int)src - iVar23;
              uVar11 = UVar25 - uVar18;
              pBVar29 = pBVar4;
              if (uVar11 < uVar21) {
                pBVar29 = pBVar6;
              }
              puVar40 = (ulong *)src;
              uVar42 = uVar33;
              uVar26 = uVar18;
              if (((UVar35 - uVar44 <= uVar18) || ((uVar21 - 1) - uVar11 < 3)) ||
                 (*(int *)(pBVar29 + uVar11) != (int)*src)) break;
              puVar40 = iEnd;
              if (uVar11 < uVar21) {
                puVar40 = puVar27;
              }
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar29 + uVar11) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar40,(BYTE *)piVar13);
              if (src <= puVar14) {
                piVar46 = (int *)seqStore->lit;
                iVar34 = *(int *)((long)src + 4);
                uVar36 = *(ulong *)((long)src + 8);
                iVar12 = *(int *)((long)src + 0xc);
                *piVar46 = (int)*src;
                piVar46[1] = iVar34;
                piVar46[2] = (int)uVar36;
                piVar46[3] = iVar12;
                psVar24 = seqStore->sequences;
              }
              psVar24->litLength = 0;
              psVar24->offset = 1;
              if (0xffff < sVar15 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar24->matchLength = (U16)(sVar15 + 1);
              psVar24 = psVar24 + 1;
              seqStore->sequences = psVar24;
              if (uVar10 < 4) {
                sVar15 = (*(code *)(&DAT_007d4b9c + *(int *)(&DAT_007d4b9c + uVar43 * 4)))();
                return sVar15;
              }
              pUVar5[(uint)((int)*src * -0x61c8864f) >> (bVar16 & 0x1f)] = UVar25;
              src = (void *)((long)src + sVar15 + 4);
              puVar40 = (ulong *)src;
              uVar42 = uVar18;
              uVar26 = uVar33;
              uVar33 = uVar18;
            } while (src <= puVar2);
          }
        }
        else {
          if ((uVar44 <= uVar33) && (piVar46 = (int *)(pBVar29 + uVar33), *piVar46 == (int)*puVar40)
             ) {
            piVar39 = piVar13;
            puVar20 = iEnd;
            if (uVar33 < uVar21) {
              piVar39 = (int *)(pBVar6 + uVar44);
              puVar20 = puVar27;
            }
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar40 + 4),(BYTE *)(piVar46 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar20,(BYTE *)piVar13);
            lVar30 = sVar15 + 4;
            if ((piVar39 < piVar46) && (src < puVar40)) {
              piVar46 = (int *)(pBVar29 + uVar33);
              do {
                piVar46 = (int *)((long)piVar46 + -1);
                puVar20 = (ulong *)((long)puVar40 + -1);
                if ((*(BYTE *)puVar20 != *(BYTE *)piVar46) ||
                   (lVar30 = lVar30 + 1, puVar40 = puVar20, piVar46 <= piVar39)) break;
              } while (src < puVar20);
            }
            uVar19 = (long)puVar40 - (long)src;
            puVar20 = (ulong *)seqStore->lit;
            if (puVar14 < puVar40) {
              puVar32 = puVar20;
              puVar41 = (ulong *)src;
              if (src <= puVar14) {
                puVar32 = (ulong *)((long)puVar20 + ((long)puVar14 - (long)src));
                uVar45 = *(ulong *)((long)src + 8);
                *puVar20 = *src;
                puVar20[1] = uVar45;
                puVar41 = puVar14;
                if (0x10 < (long)puVar14 - (long)src) {
                  lVar31 = 0x10;
                  do {
                    uVar7 = *(undefined8 *)((BYTE *)((long)src + lVar31) + 8);
                    puVar1 = (undefined8 *)((long)puVar20 + lVar31);
                    *puVar1 = *(undefined8 *)((long)src + lVar31);
                    puVar1[1] = uVar7;
                    pBVar29 = (BYTE *)((long)src + lVar31 + 0x10);
                    uVar7 = *(undefined8 *)(pBVar29 + 8);
                    puVar1[2] = *(undefined8 *)pBVar29;
                    puVar1[3] = uVar7;
                    lVar31 = lVar31 + 0x20;
                  } while (puVar1 + 4 < puVar32);
                }
              }
              if (puVar41 < puVar40) {
                lVar31 = 0;
                do {
                  *(BYTE *)((long)puVar32 + lVar31) = *(BYTE *)((long)puVar41 + lVar31);
                  lVar31 = lVar31 + 1;
                } while ((long)puVar40 - (long)puVar41 != lVar31);
              }
LAB_006a3af8:
              seqStore->lit = seqStore->lit + uVar19;
              psVar24 = seqStore->sequences;
              if (0xffff < uVar19) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar45 = *(ulong *)((long)src + 8);
              *puVar20 = *src;
              puVar20[1] = uVar45;
              pBVar29 = seqStore->lit;
              if (0x10 < uVar19) {
                uVar45 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar29 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar29 + 0x18) = uVar45;
                if (0x20 < (long)uVar19) {
                  lVar31 = 0;
                  do {
                    pBVar3 = (BYTE *)((long)src + lVar31 + 0x20);
                    uVar7 = *(undefined8 *)(pBVar3 + 8);
                    pBVar28 = pBVar29 + lVar31 + 0x20;
                    *(undefined8 *)pBVar28 = *(undefined8 *)pBVar3;
                    *(undefined8 *)(pBVar28 + 8) = uVar7;
                    pBVar3 = (BYTE *)((long)src + lVar31 + 0x30);
                    uVar7 = *(undefined8 *)(pBVar3 + 8);
                    *(undefined8 *)(pBVar28 + 0x10) = *(undefined8 *)pBVar3;
                    *(undefined8 *)(pBVar28 + 0x18) = uVar7;
                    lVar31 = lVar31 + 0x20;
                  } while (pBVar28 + 0x20 < pBVar29 + uVar19);
                }
                goto LAB_006a3af8;
              }
              seqStore->lit = pBVar29 + uVar19;
              psVar24 = seqStore->sequences;
            }
            psVar24->litLength = (U16)uVar19;
            psVar24->offset = (UVar35 - uVar33) + 3;
            if (0xffff < lVar30 - 3U) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar24->matchLength = (U16)(lVar30 - 3U);
            psVar24 = psVar24 + 1;
            seqStore->sequences = psVar24;
            src = (void *)((long)puVar40 + lVar30);
            uVar33 = UVar35 - uVar33;
            uVar26 = uVar42;
            goto LAB_006a3b71;
          }
          puVar40 = (ulong *)((long)puVar40 + ((long)puVar40 - (long)src >> 8) + (ulong)uVar9);
        }
      } while (puVar40 < puVar2);
    }
    *rep = uVar42;
  }
  else {
    uVar44 = iVar34 - uVar10;
    if (iVar34 - uVar21 <= uVar10) {
      uVar44 = uVar21;
    }
    if (UVar35 != 0) {
      uVar44 = uVar21;
    }
    piVar13 = (int *)(pBVar4 + uVar44);
    puVar27 = (ulong *)((long)src + (ulong)(piVar13 == (int *)src));
    iVar34 = (int)puVar27 - iVar23;
    uVar33 = iVar34 - uVar10;
    if (iVar34 - uVar21 <= uVar10) {
      uVar33 = uVar21;
    }
    if (UVar35 != 0) {
      uVar33 = uVar21;
    }
    uVar33 = iVar34 - uVar33;
    uVar21 = 0;
    if (uVar33 < uVar26) {
      uVar21 = uVar26;
    }
    puVar40 = (ulong *)((long)src + (ulong)(piVar13 == (int *)src) + 1);
    if (uVar33 < uVar26) {
      uVar26 = 0;
    }
    uVar10 = uVar42;
    if (uVar33 < uVar42) {
      uVar10 = 0;
      uVar21 = uVar42;
    }
    uVar43 = (ulong)uVar10;
    if (puVar40 < puVar2) {
      bVar16 = 0x40 - cVar8;
      bVar17 = 0x20 - cVar8;
      puVar14 = (ulong *)((long)iEnd - 7);
      puVar20 = iEnd + -4;
      do {
        iVar34 = mls - 5;
        switch(iVar34) {
        case 0:
          uVar45 = *puVar27;
          lVar30 = -0x30e4432345000000;
          break;
        case 1:
          uVar45 = *puVar27;
          lVar30 = -0x30e4432340650000;
          break;
        case 2:
          uVar45 = *puVar27;
          lVar30 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar45 = *puVar27;
          uVar19 = uVar45 * -0x30e44323485a9b9d >> (bVar16 & 0x3f);
          uVar37 = *puVar40;
          uVar36 = uVar37 * -0x30e44323485a9b9d;
          goto LAB_006a3f7e;
        default:
          iVar12 = (int)*puVar27;
          uVar19 = (ulong)((uint)(iVar12 * -0x61c8864f) >> (bVar17 & 0x1f));
          iVar38 = (int)*puVar40;
          uVar36 = (ulong)((uint)(iVar38 * -0x61c8864f) >> (bVar17 & 0x1f));
          goto LAB_006a3f81;
        }
        uVar19 = uVar45 * lVar30 >> (bVar16 & 0x3f);
        uVar37 = *puVar40;
        uVar36 = lVar30 * uVar37;
LAB_006a3f7e:
        iVar38 = (int)uVar37;
        iVar12 = (int)uVar45;
        uVar36 = uVar36 >> (bVar16 & 0x3f);
LAB_006a3f81:
        uVar45 = (long)puVar27 - (long)pBVar4;
        uVar10 = pUVar5[uVar19];
        uVar42 = pUVar5[uVar36];
        UVar35 = (U32)uVar45;
        pUVar5[uVar19] = UVar35;
        pUVar5[uVar36] = (int)puVar40 - iVar23;
        uVar33 = (uint)uVar43;
        if ((uVar33 == 0) || (*(int *)((long)puVar27 + (2 - uVar43)) != *(int *)((long)puVar27 + 2))
           ) {
          if (((uVar44 < uVar10) &&
              (piVar46 = (int *)(pBVar4 + uVar10), puVar32 = puVar27, *piVar46 == iVar12)) ||
             ((uVar44 < uVar42 &&
              (piVar46 = (int *)(pBVar4 + uVar42), puVar32 = puVar40, *piVar46 == iVar38)))) {
            uVar10 = (int)puVar32 - (int)piVar46;
            uVar43 = (ulong)uVar10;
            iVar12 = uVar10 + 2;
            uVar36 = 4;
            if (piVar13 < piVar46) {
              while (src < puVar32) {
                puVar27 = (ulong *)((long)puVar32 + -1);
                piVar39 = (int *)((long)piVar46 + -1);
                if ((*(BYTE *)puVar27 != *(BYTE *)piVar39) ||
                   (uVar36 = uVar36 + 1, piVar46 = piVar39, puVar32 = puVar27, piVar39 <= piVar13))
                break;
              }
            }
            goto LAB_006a40d0;
          }
          lVar30 = ((ulong)((long)puVar27 - (long)src) >> 7) + (ulong)(uVar9 + 1);
          puVar27 = (ulong *)((long)puVar27 + lVar30);
          puVar40 = (ulong *)((long)puVar40 + lVar30);
        }
        else {
          uVar19 = (ulong)(*(BYTE *)((long)puVar27 + 1) == *(BYTE *)((long)puVar27 + -uVar43 + 1));
          uVar36 = uVar19 | 4;
          iVar12 = 0;
          piVar46 = (int *)((long)puVar27 + ((-uVar43 + 2) - uVar19));
          puVar32 = (ulong *)((long)puVar27 + (2 - uVar19));
          uVar33 = uVar26;
LAB_006a40d0:
          uVar10 = (uint)uVar43;
          puVar27 = (ulong *)(uVar36 + (long)puVar32);
          puVar40 = (ulong *)((long)piVar46 + uVar36);
          puVar41 = puVar27;
          if (puVar27 < puVar14) {
            if (*puVar40 == *puVar27) {
              lVar30 = 0;
              do {
                puVar40 = (ulong *)((long)puVar32 + lVar30 + uVar36 + 8);
                if (puVar14 <= puVar40) {
                  puVar40 = (ulong *)((long)piVar46 + lVar30 + uVar36 + 8);
                  puVar41 = (ulong *)((long)puVar32 + lVar30 + uVar36 + 8);
                  goto LAB_006a4157;
                }
                uVar19 = *(ulong *)((long)piVar46 + lVar30 + uVar36 + 8);
                uVar37 = *puVar40;
                lVar30 = lVar30 + 8;
              } while (uVar19 == uVar37);
              uVar37 = uVar37 ^ uVar19;
              uVar19 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar30;
            }
            else {
              uVar37 = *puVar27 ^ *puVar40;
              uVar19 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              uVar19 = uVar19 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_006a4157:
            if ((puVar41 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar40 == (int)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 4);
              puVar40 = (ulong *)((long)puVar40 + 4);
            }
            if ((puVar41 < (ulong *)((long)iEnd - 1U)) && ((short)*puVar40 == (short)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 2);
              puVar40 = (ulong *)((long)puVar40 + 2);
            }
            if (puVar41 < iEnd) {
              puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar41));
            }
            uVar19 = (long)puVar41 - (long)puVar27;
          }
          uVar37 = (long)puVar32 - (long)src;
          puVar27 = (ulong *)seqStore->lit;
          if (puVar20 < puVar32) {
            puVar40 = puVar27;
            puVar41 = (ulong *)src;
            if (src <= puVar20) {
              puVar40 = (ulong *)((long)puVar27 + ((long)puVar20 - (long)src));
              uVar22 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar22;
              puVar41 = puVar20;
              if (0x10 < (long)puVar20 - (long)src) {
                lVar30 = 0x10;
                do {
                  uVar7 = *(undefined8 *)((BYTE *)((long)src + lVar30) + 8);
                  puVar1 = (undefined8 *)((long)puVar27 + lVar30);
                  *puVar1 = *(undefined8 *)((long)src + lVar30);
                  puVar1[1] = uVar7;
                  pBVar6 = (BYTE *)((long)src + lVar30 + 0x10);
                  uVar7 = *(undefined8 *)(pBVar6 + 8);
                  puVar1[2] = *(undefined8 *)pBVar6;
                  puVar1[3] = uVar7;
                  lVar30 = lVar30 + 0x20;
                } while (puVar1 + 4 < puVar40);
              }
            }
            if (puVar41 < puVar32) {
              lVar30 = 0;
              do {
                *(BYTE *)((long)puVar40 + lVar30) = *(BYTE *)((long)puVar41 + lVar30);
                lVar30 = lVar30 + 1;
              } while ((long)puVar32 - (long)puVar41 != lVar30);
            }
LAB_006a42a1:
            seqStore->lit = seqStore->lit + uVar37;
            psVar24 = seqStore->sequences;
            if (0xffff < uVar37) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar22 = *(ulong *)((long)src + 8);
            *puVar27 = *src;
            puVar27[1] = uVar22;
            pBVar6 = seqStore->lit;
            if (0x10 < uVar37) {
              uVar22 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar6 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar6 + 0x18) = uVar22;
              if (0x20 < (long)uVar37) {
                lVar30 = 0;
                do {
                  pBVar28 = (BYTE *)((long)src + lVar30 + 0x20);
                  uVar7 = *(undefined8 *)(pBVar28 + 8);
                  pBVar29 = pBVar6 + lVar30 + 0x20;
                  *(undefined8 *)pBVar29 = *(undefined8 *)pBVar28;
                  *(undefined8 *)(pBVar29 + 8) = uVar7;
                  pBVar28 = (BYTE *)((long)src + lVar30 + 0x30);
                  uVar7 = *(undefined8 *)(pBVar28 + 8);
                  *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)pBVar28;
                  *(undefined8 *)(pBVar29 + 0x18) = uVar7;
                  lVar30 = lVar30 + 0x20;
                } while (pBVar29 + 0x20 < pBVar6 + uVar37);
              }
              goto LAB_006a42a1;
            }
            seqStore->lit = pBVar6 + uVar37;
            psVar24 = seqStore->sequences;
          }
          uVar22 = (uVar19 + uVar36) - 3;
          psVar24->litLength = (U16)uVar37;
          psVar24->offset = iVar12 + 1;
          if (0xffff < uVar22) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar24->matchLength = (U16)uVar22;
          psVar24 = psVar24 + 1;
          seqStore->sequences = psVar24;
          puVar27 = (ulong *)((long)puVar32 + uVar19 + uVar36);
          if (puVar27 <= puVar2) {
            UVar35 = UVar35 + 2;
            uVar45 = uVar45 & 0xffffffff;
            switch(iVar34) {
            case 0:
              lVar30 = -0x30e4432345000000;
              break;
            case 1:
              lVar30 = -0x30e4432340650000;
              break;
            case 2:
              lVar30 = -0x30e44323405a9d00;
              break;
            case 3:
              pUVar5[(ulong)(*(long *)(pBVar4 + uVar45 + 2) * -0x30e44323485a9b9d) >>
                     (bVar16 & 0x3f)] = UVar35;
              uVar36 = *(long *)((long)puVar27 + -2) * -0x30e44323485a9b9d;
              goto LAB_006a43d3;
            default:
              pUVar5[(uint)(*(int *)(pBVar4 + uVar45 + 2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
                   UVar35;
              uVar36 = (ulong)((uint)(*(int *)((long)puVar27 + -2) * -0x61c8864f) >> (bVar17 & 0x1f)
                              );
              goto LAB_006a43d6;
            }
            pUVar5[(ulong)(*(long *)(pBVar4 + uVar45 + 2) * lVar30) >> (bVar16 & 0x3f)] = UVar35;
            uVar36 = lVar30 * *(long *)((long)puVar27 + -2);
LAB_006a43d3:
            uVar36 = uVar36 >> (bVar16 & 0x3f);
LAB_006a43d6:
            pUVar5[uVar36] = ((int)puVar27 + -2) - iVar23;
            if (uVar33 == 0) {
              uVar33 = 0;
            }
            else {
              do {
                uVar42 = uVar33;
                uVar36 = (ulong)uVar42;
                uVar10 = (uint)uVar43;
                uVar33 = uVar42;
                if ((int)*puVar27 != *(int *)((long)puVar27 - uVar36)) break;
                lVar30 = -uVar36;
                puVar40 = (ulong *)((long)puVar27 + 4);
                puVar41 = (ulong *)((long)puVar27 + lVar30 + 4);
                puVar32 = puVar40;
                if (puVar40 < puVar14) {
                  if (*puVar41 == *puVar40) {
                    lVar31 = 0;
                    do {
                      puVar32 = (ulong *)((long)puVar27 + lVar31 + 0xc);
                      if (puVar14 <= puVar32) {
                        puVar41 = (ulong *)((long)puVar27 + lVar30 + lVar31 + 0xc);
                        puVar32 = (ulong *)((long)puVar27 + lVar31 + 0xc);
                        goto LAB_006a4492;
                      }
                      uVar43 = *(ulong *)((long)puVar27 + lVar31 + lVar30 + 0xc);
                      uVar19 = *puVar32;
                      lVar31 = lVar31 + 8;
                    } while (uVar43 == uVar19);
                    uVar19 = uVar19 ^ uVar43;
                    uVar43 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar43 = (uVar43 >> 3 & 0x1fffffff) + lVar31;
                  }
                  else {
                    uVar19 = *puVar40 ^ *puVar41;
                    uVar43 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar43 = uVar43 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_006a4492:
                  if ((puVar32 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar41 == (int)*puVar32)) {
                    puVar32 = (ulong *)((long)puVar32 + 4);
                    puVar41 = (ulong *)((long)puVar41 + 4);
                  }
                  if ((puVar32 < (ulong *)((long)iEnd - 1U)) && ((short)*puVar41 == (short)*puVar32)
                     ) {
                    puVar32 = (ulong *)((long)puVar32 + 2);
                    puVar41 = (ulong *)((long)puVar41 + 2);
                  }
                  if (puVar32 < iEnd) {
                    puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar32));
                  }
                  uVar43 = (long)puVar32 - (long)puVar40;
                }
                switch(iVar34) {
                case 0:
                  lVar30 = -0x30e4432345000000;
                  break;
                case 1:
                  lVar30 = -0x30e4432340650000;
                  break;
                case 2:
                  lVar30 = -0x30e44323405a9d00;
                  break;
                case 3:
                  uVar19 = *puVar27 * -0x30e44323485a9b9d;
                  goto LAB_006a4543;
                default:
                  uVar19 = (ulong)((uint)((int)*puVar27 * -0x61c8864f) >> (bVar17 & 0x1f));
                  goto LAB_006a454b;
                }
                uVar19 = lVar30 * *puVar27;
LAB_006a4543:
                uVar19 = uVar19 >> (bVar16 & 0x3f);
LAB_006a454b:
                pUVar5[uVar19] = (int)puVar27 - iVar23;
                if (puVar27 <= puVar20) {
                  puVar40 = (ulong *)seqStore->lit;
                  uVar19 = puVar27[1];
                  *puVar40 = *puVar27;
                  puVar40[1] = uVar19;
                  psVar24 = seqStore->sequences;
                }
                psVar24->litLength = 0;
                psVar24->offset = 1;
                if (0xffff < uVar43 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar27 = (ulong *)((long)puVar27 + uVar43 + 4);
                psVar24->matchLength = (U16)(uVar43 + 1);
                psVar24 = psVar24 + 1;
                seqStore->sequences = psVar24;
                uVar43 = uVar36;
                uVar33 = uVar10;
                uVar10 = uVar42;
              } while (puVar27 <= puVar2);
            }
          }
          puVar40 = (ulong *)((long)puVar27 + 1);
          uVar43 = (ulong)uVar10;
          src = puVar27;
          uVar26 = uVar33;
        }
        uVar10 = (uint)uVar43;
      } while (puVar40 < puVar2);
    }
    if (uVar10 == 0) {
      uVar10 = uVar21;
    }
    *rep = uVar10;
    if (uVar26 == 0) {
      uVar26 = uVar21;
    }
  }
  rep[1] = uVar26;
  return (long)iEnd - (long)src;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, mls);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    curr = (U32)(ip-base);
        const U32    repIndex = curr + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        hashTable[h] = curr;   /* update hash table */
        DEBUGLOG(7, "offset_1 = %u , curr = %u", offset_1, curr);

        if ( ( ((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */
             & (offset_1 < curr+1 - dictStartIndex) ) /* note: we are searching at curr+1 */
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* const repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            size_t const rLength = ZSTD_count_2segments(ip+1 +4, repMatch +4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, rLength-MINMATCH);
            ip += rLength;
            anchor = ip;
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 const offset = curr - matchIndex;
                size_t mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset_2 = offset_1; offset_1 = offset;  /* update offset history */
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
                ip += mLength;
                anchor = ip;
        }   }

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+curr+2, hlog, mls)] = curr+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 < curr - dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, 0 /*offcode*/, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}